

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::MatchTrimEnds(ON_Brep *this)

{
  bool bVar1;
  bool bVar2;
  int i;
  long lVar3;
  long lVar4;
  
  bVar2 = true;
  lVar4 = 0;
  for (lVar3 = 0;
      lVar3 < (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count
      ; lVar3 = lVar3 + 1) {
    bVar1 = MatchTrimEnds(this,(ON_BrepLoop *)
                               ((long)&(((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                                         super_ON_ClassArray<ON_BrepLoop>.m_a)->super_ON_Geometry).
                                       super_ON_Object._vptr_ON_Object + lVar4));
    bVar2 = (bool)(bVar2 & bVar1);
    lVar4 = lVar4 + 0x78;
  }
  return bVar2;
}

Assistant:

bool ON_Brep::MatchTrimEnds()

{
  bool rc = true;
  for (int i=0; i<m_L.Count(); i++){
    if (!MatchTrimEnds(m_L[i])) rc = false;
  }
  return rc;
}